

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_LoadZSegs(FileReaderBase *data)

{
  line_t *plVar1;
  uint uVar2;
  line_t *plVar3;
  long lVar4;
  long lVar5;
  BYTE side;
  WORD line;
  DWORD v2;
  DWORD v1;
  byte local_3b;
  ushort local_3a;
  uint local_38;
  uint local_34;
  
  if (0 < numsegs) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      (*data->_vptr_FileReaderBase[2])(data,&local_34,4);
      (*data->_vptr_FileReaderBase[2])(data,&local_38,4);
      (*data->_vptr_FileReaderBase[2])(data,&local_3a,2);
      (*data->_vptr_FileReaderBase[2])(data,&local_3b,1);
      *(vertex_t **)((long)&segs->v1 + lVar4) = vertexes + local_34;
      *(vertex_t **)((long)&segs->v2 + lVar4) = vertexes + local_38;
      plVar3 = lines;
      plVar1 = lines + local_3a;
      *(line_t **)((long)&segs->linedef + lVar4) = plVar1;
      *(side_t **)((long)&segs->sidedef + lVar4) = plVar1->sidedef[local_3b];
      *(sector_t **)((long)&segs->frontsector + lVar4) = plVar1->sidedef[local_3b]->sector;
      uVar2 = plVar3[local_3a].flags;
      if (((uVar2 & 4) == 0) || (plVar1->sidedef[local_3b ^ 1] == (side_t *)0x0)) {
        *(undefined8 *)((long)&segs->backsector + lVar4) = 0;
        plVar1->flags = uVar2 & 0xfffffffb;
      }
      else {
        *(sector_t **)((long)&segs->backsector + lVar4) = plVar1->sidedef[local_3b ^ 1]->sector;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x48;
    } while (lVar5 < numsegs);
  }
  return;
}

Assistant:

void P_LoadZSegs (FileReaderBase &data)
{
	for (int i = 0; i < numsegs; ++i)
	{
		line_t *ldef;
		DWORD v1, v2;
		WORD line;
		BYTE side;

		data >> v1 >> v2 >> line >> side;

		segs[i].v1 = &vertexes[v1];
		segs[i].v2 = &vertexes[v2];
		segs[i].linedef = ldef = &lines[line];
		segs[i].sidedef = ldef->sidedef[side];
		segs[i].frontsector = ldef->sidedef[side]->sector;
		if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
		{
			segs[i].backsector = ldef->sidedef[side^1]->sector;
		}
		else
		{
			segs[i].backsector = 0;
			ldef->flags &= ~ML_TWOSIDED;
		}
	}
}